

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::UpdateAlphas(Alice *this)

{
  pointer plVar1;
  pointer plVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  long lVar7;
  ulong uVar8;
  pointer pvVar9;
  long lVar10;
  
  lVar7 = (long)(this->super_Party).n_p;
  if (0 < lVar7) {
    plVar1 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->super_Party).P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar2 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (ulong)(uint)(this->super_Party).alpha_rc;
    lVar10 = 0;
    do {
      *(long *)(*(long *)&(pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data + 0x20) = plVar1[(int)uVar8] + lVar10;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = (long)plVar2 - (long)plVar1 >> 3;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = (long)((int)uVar8 + 1);
      uVar8 = SUB128(auVar5 % auVar3,0);
      lVar10 = lVar10 + 1;
      pvVar9 = pvVar9 + 1;
    } while (lVar7 != lVar10);
    (this->super_Party).alpha_rc = SUB124(auVar5 % auVar3,0);
  }
  lVar7 = (long)(this->super_Party).n_d;
  if (0 < lVar7) {
    plVar1 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar2 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (ulong)(uint)(this->super_Party).alpha_rc;
    lVar10 = 0;
    do {
      *(long *)(*(long *)&(pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data + 8) = plVar1[(int)uVar8] + lVar10;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = (long)plVar2 - (long)plVar1 >> 3;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = (long)((int)uVar8 + 1);
      uVar8 = SUB128(auVar6 % auVar4,0);
      lVar10 = lVar10 + 1;
      pvVar9 = pvVar9 + 1;
    } while (lVar7 != lVar10);
    (this->super_Party).alpha_rc = SUB124(auVar6 % auVar4,0);
  }
  return;
}

Assistant:

void Alice::UpdateAlphas()
{
    for(int i = 0; i < n_p; i++)
    {
        P[i][4] = i + AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }
    for(int i = 0; i < n_d; i++)
    {
        D[i][1] = i + AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size(); 
    }  
}